

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::copy
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter> *this,
          EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_type sVar1;
  Expression *pEVar2;
  byte *pbVar3;
  byte *pbVar4;
  pointer pMVar5;
  byte *pbVar6;
  pointer pMVar7;
  byte *pbVar8;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar6 = pbVar3 + sVar1 * 0x10;
  if (*(byte **)(dst + 8) < pbVar6) {
    pbVar4 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x10,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_0072af58;
    pMVar5 = this->data_;
    pMVar7 = pMVar5 + sVar1;
    pbVar6 = pbVar4 + sVar1 * 0x10;
    pbVar3 = pbVar4;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar6;
    pMVar5 = this->data_;
    pMVar7 = pMVar5 + sVar1;
    pbVar4 = pbVar3;
  }
  do {
    pbVar8 = pbVar3 + 0x10;
    pEVar2 = (pMVar5->expr).ptr;
    *(Symbol **)pbVar3 = (pMVar5->member).ptr;
    *(Expression **)(pbVar3 + 8) = pEVar2;
    if (pMVar5 + 1 == pMVar7) break;
    pMVar5 = pMVar5 + 1;
    pbVar3 = pbVar8;
  } while (pbVar8 != pbVar6);
LAB_0072af58:
  return (int)pbVar4;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }